

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTotals(ConsoleReporter *this,Totals *totals)

{
  size_t sVar1;
  pointer pcVar2;
  ostream *poVar3;
  string *this_00;
  allocator local_b2;
  allocator local_b1;
  undefined1 local_b0 [40];
  string local_88 [32];
  string local_68 [32];
  undefined1 local_48 [40];
  
  sVar1 = (totals->assertions).failed;
  if ((totals->assertions).passed + sVar1 == 0) {
    std::operator<<((this->super_StreamingReporterBase).stream,"No tests ran");
    return;
  }
  if (sVar1 == 0) {
    (**(code **)(*Colour::impl + 0x10))(Colour::impl,0x13);
    poVar3 = std::operator<<((this->super_StreamingReporterBase).stream,"All tests passed (");
    pcVar2 = (pointer)(totals->assertions).passed;
    std::__cxx11::string::string(local_68,"assertion",&local_b1);
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::string((string *)(local_b0 + 8),local_68);
    poVar3 = operator<<(poVar3,(pluralise *)local_b0);
    poVar3 = std::operator<<(poVar3," in ");
    sVar1 = (totals->testCases).passed;
    std::__cxx11::string::string(local_88,"test case",&local_b2);
    local_48._0_8_ = sVar1;
    std::__cxx11::string::string((string *)(local_48 + 8),local_88);
    poVar3 = operator<<(poVar3,(pluralise *)local_48);
    std::operator<<(poVar3,")");
    std::__cxx11::string::~string((string *)(local_48 + 8));
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string((string *)(local_b0 + 8));
    this_00 = local_68;
    std::__cxx11::string::~string(this_00);
  }
  else {
    (**(code **)(*Colour::impl + 0x10))(Colour::impl,0x12);
    std::__cxx11::string::string((string *)local_b0,"test case",(allocator *)local_48);
    printCounts(this,(string *)local_b0,&totals->testCases);
    this_00 = (string *)local_b0;
    std::__cxx11::string::~string(this_00);
    if ((totals->testCases).failed != 0) {
      std::operator<<((this->super_StreamingReporterBase).stream," (");
      std::__cxx11::string::string((string *)local_b0,"assertion",(allocator *)local_48);
      printCounts(this,(string *)local_b0,&totals->assertions);
      std::__cxx11::string::~string((string *)local_b0);
      this_00 = (string *)(this->super_StreamingReporterBase).stream;
      std::operator<<((ostream *)this_00,")");
    }
  }
  Colour::~Colour((Colour *)this_00);
  return;
}

Assistant:

void printTotals( const Totals& totals ) {
            if( totals.assertions.total() == 0 ) {
                stream << "No tests ran";
            }
            else if( totals.assertions.failed ) {
                Colour colour( Colour::ResultError );
                printCounts( "test case", totals.testCases );
                if( totals.testCases.failed > 0 ) {
                    stream << " (";
                    printCounts( "assertion", totals.assertions );
                    stream << ")";
                }
            }
            else {
                Colour colour( Colour::ResultSuccess );
                stream << "All tests passed ("
                        << pluralise( totals.assertions.passed, "assertion" ) << " in "
                        << pluralise( totals.testCases.passed, "test case" ) << ")";
            }
        }